

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void Js::DynamicProfileInfo::Save(ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  SourceContextInfoMap *pSVar3;
  DynamicProfileInfoList *pDVar4;
  SourceContextInfo *pSVar5;
  undefined4 *puVar6;
  ScriptContext *scriptContext_local;
  
  bVar2 = DynamicProfileStorage::IsEnabled();
  if (bVar2) {
    pSVar3 = ScriptContext::GetSourceContextInfoMap(scriptContext);
    if (pSVar3 == (SourceContextInfoMap *)0x0) {
      pDVar4 = ScriptContext::GetProfileInfoList(scriptContext);
      if (pDVar4 != (DynamicProfileInfoList *)0x0) {
        pDVar4 = ScriptContext::GetProfileInfoList(scriptContext);
        bVar2 = SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::Empty(pDVar4);
        if ((!bVar2) &&
           (pSVar5 = ScriptContext::GetNoContextSourceContextInfo(scriptContext),
           pSVar5->nextLocalFunctionId == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                      ,0x5d6,
                                      "(!scriptContext->GetProfileInfoList() || scriptContext->GetProfileInfoList()->Empty() || scriptContext->GetNoContextSourceContextInfo()->nextLocalFunctionId != 0)"
                                      ,
                                      "!scriptContext->GetProfileInfoList() || scriptContext->GetProfileInfoList()->Empty() || scriptContext->GetNoContextSourceContextInfo()->nextLocalFunctionId != 0"
                                     );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
    else {
      UpdateSourceDynamicProfileManagers(scriptContext);
      pSVar3 = ScriptContext::GetSourceContextInfoMap(scriptContext);
      JsUtil::
      BaseDictionary<unsigned_long,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::Map<Js::DynamicProfileInfo::Save(Js::ScriptContext*)::__0>
                ((BaseDictionary<unsigned_long,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)pSVar3);
    }
  }
  return;
}

Assistant:

void DynamicProfileInfo::Save(ScriptContext * scriptContext)
    {
        // For now, we only support our local storage
#ifdef DYNAMIC_PROFILE_STORAGE
        if (!DynamicProfileStorage::IsEnabled())
        {
            return;
        }

        if (scriptContext->GetSourceContextInfoMap() == nullptr)
        {
            // We don't have savable code
            Assert(!scriptContext->GetProfileInfoList() || scriptContext->GetProfileInfoList()->Empty() || scriptContext->GetNoContextSourceContextInfo()->nextLocalFunctionId != 0);
            return;
        }
        DynamicProfileInfo::UpdateSourceDynamicProfileManagers(scriptContext);

        scriptContext->GetSourceContextInfoMap()->Map([&](DWORD_PTR dwHostSourceContext, SourceContextInfo * sourceContextInfo)
        {
            if (sourceContextInfo->sourceDynamicProfileManager != nullptr && sourceContextInfo->url != nullptr
                && !sourceContextInfo->IsDynamic())
            {
                sourceContextInfo->sourceDynamicProfileManager->SaveToDynamicProfileStorage(sourceContextInfo->url);
            }
        });
#endif
    }